

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::FetchRowValidity
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  UpdateInfo *current;
  UndoBufferPointer update_ptr;
  UndoBufferPointer local_98;
  anon_class_24_3_1e69923c local_80;
  idx_t local_68;
  idx_t local_60;
  UndoBufferReference local_58;
  
  local_68 = result_idx;
  local_60 = row_idx;
  FlatVector::VerifyFlatVector(result);
  local_80.result_mask = &result->validity;
  local_80.row_idx = &local_60;
  local_80.result_idx = &local_68;
  if ((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
     ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
    FetchRowValidity::anon_class_24_3_1e69923c::operator()(&local_80,info);
  }
  local_98.entry = (info->next).entry;
  local_98.position = (info->next).position;
  if (local_98.entry != (UndoBufferEntry *)0x0) {
    do {
      UndoBufferPointer::Pin(&local_58,&local_98);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
      current = (UpdateInfo *)((local_58.handle.node.ptr)->buffer + local_58.position);
      if ((start_time < *(ulong *)((local_58.handle.node.ptr)->buffer + local_58.position + 0x10))
         && ((current->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
        FetchRowValidity::anon_class_24_3_1e69923c::operator()(&local_80,current);
      }
      local_98.entry = (current->next).entry;
      local_98.position = (current->next).position;
      BufferHandle::~BufferHandle(&local_58.handle);
    } while (local_98.entry != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

static void FetchRowValidity(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                             Vector &result, idx_t result_idx) {
	auto &result_mask = FlatVector::Validity(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<bool>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_mask.Set(result_idx, info_data[i]);
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}